

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNdr.c
# Opt level: O0

void Wln_NtkCheckIntegrity(void *pData)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  int *piStack_40;
  int nArray;
  int *pArray;
  int i;
  int Type_1;
  int Type;
  int NameId;
  int Obj;
  int Mod;
  Vec_Int_t *vMap;
  Ndr_Data_t *p;
  void *pData_local;
  
  vMap = (Vec_Int_t *)pData;
  p = (Ndr_Data_t *)pData;
  _Obj = Vec_IntAlloc(100);
  NameId = 2;
  for (Type = 3; iVar2 = Type, iVar1 = Ndr_DataEnd((Ndr_Data_t *)vMap,NameId), iVar2 < iVar1;
      Type = iVar2 + Type) {
    iVar2 = Ndr_DataType((Ndr_Data_t *)vMap,Type);
    if (iVar2 == 3) {
      Type_1 = Ndr_ObjReadBody((Ndr_Data_t *)vMap,Type,5);
      if (Type_1 == -1) {
        i = Ndr_ObjReadBody((Ndr_Data_t *)vMap,Type,6);
        iVar2 = Type;
        if (i != 4) {
          pcVar4 = Abc_OperName(i);
          printf("Internal object %d of type %s has no output name.\n",(ulong)(uint)iVar2,pcVar4);
        }
      }
      else {
        iVar1 = Vec_IntGetEntry(_Obj,Type_1);
        iVar2 = Type_1;
        if (0 < iVar1) {
          uVar3 = Vec_IntGetEntry(_Obj,Type_1);
          printf("Output name %d is used more than once (obj %d and obj %d).\n",(ulong)(uint)iVar2,
                 (ulong)uVar3,(ulong)(uint)Type);
        }
        Vec_IntSetEntry(_Obj,Type_1,Type);
      }
    }
    iVar2 = Ndr_DataSize((Ndr_Data_t *)vMap,Type);
  }
  for (Type = NameId + 1; iVar2 = Type, iVar1 = Ndr_DataEnd((Ndr_Data_t *)vMap,NameId),
      iVar2 < iVar1; Type = iVar2 + Type) {
    iVar2 = Ndr_DataType((Ndr_Data_t *)vMap,Type);
    if (iVar2 == 3) {
      pArray._4_4_ = Ndr_ObjReadBody((Ndr_Data_t *)vMap,Type,6);
      iVar2 = Ndr_ObjReadArray((Ndr_Data_t *)vMap,Type,4,&stack0xffffffffffffffc0);
      for (pArray._0_4_ = 0; (int)(uint)pArray < iVar2; pArray._0_4_ = (uint)pArray + 1) {
        iVar1 = Vec_IntGetEntry(_Obj,piStack_40[(int)(uint)pArray]);
        if ((iVar1 == 0) &&
           (((pArray._4_4_ != 0x59 || ((int)(uint)pArray < 5)) || (7 < (int)(uint)pArray)))) {
          printf("Input name %d appearing as fanin %d of obj %d is not used as output name in any object.\n"
                 ,(ulong)(uint)piStack_40[(int)(uint)pArray],(ulong)(uint)pArray,(ulong)(uint)Type);
        }
      }
    }
    iVar2 = Ndr_DataSize((Ndr_Data_t *)vMap,Type);
  }
  Vec_IntFree(_Obj);
  return;
}

Assistant:

void Wln_NtkCheckIntegrity( void * pData )
{
    Ndr_Data_t * p = (Ndr_Data_t *)pData;  
    Vec_Int_t * vMap = Vec_IntAlloc( 100 );
    int Mod = 2, Obj;
    Ndr_ModForEachObj( p, Mod, Obj )
    {
        int NameId  = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        if ( NameId == -1 )
        {
            int Type = Ndr_ObjReadBody( p, Obj, NDR_OPERTYPE );
            if ( Type != ABC_OPER_CO )
                printf( "Internal object %d of type %s has no output name.\n", Obj, Abc_OperName(Type) );
            continue;
        }
        if ( Vec_IntGetEntry(vMap, NameId) > 0 )
            printf( "Output name %d is used more than once (obj %d and obj %d).\n", NameId, Vec_IntGetEntry(vMap, NameId), Obj );
        Vec_IntSetEntry( vMap, NameId, Obj );
    }
    Ndr_ModForEachObj( p, Mod, Obj )
    {
        int Type = Ndr_ObjReadBody( p, Obj, NDR_OPERTYPE );
        int i, * pArray, nArray  = Ndr_ObjReadArray( p, Obj, NDR_INPUT, &pArray );
        for ( i = 0; i < nArray; i++ )
            if ( Vec_IntGetEntry(vMap, pArray[i]) == 0 && !(Type == ABC_OPER_DFFRSE && (i >= 5 && i <= 7)) )
                printf( "Input name %d appearing as fanin %d of obj %d is not used as output name in any object.\n", pArray[i], i, Obj );
    }
    Vec_IntFree( vMap );
}